

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

ArrayElementRef * __thiscall
soul::PoolAllocator::
allocate<soul::AST::ArrayElementRef,soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr<soul::AST::Expression>&,soul::pool_ptr<soul::AST::Expression>&,bool>
          (PoolAllocator *this,Context *args,Expression *args_1,
          pool_ptr<soul::AST::Expression> *args_2,pool_ptr<soul::AST::Expression> *args_3,
          bool *args_4)

{
  DestructorFn *pDVar1;
  Context *this_00;
  _lambda_void___1_ local_65 [13];
  pool_ptr<soul::AST::Expression> local_58;
  pool_ptr<soul::AST::Expression> local_50;
  ArrayElementRef *local_48;
  ArrayElementRef *newObject;
  PoolItem *newItem;
  bool *args_local_4;
  pool_ptr<soul::AST::Expression> *args_local_3;
  pool_ptr<soul::AST::Expression> *args_local_2;
  Expression *args_local_1;
  Context *args_local;
  PoolAllocator *this_local;
  
  newItem = (PoolItem *)args_4;
  args_local_4 = (bool *)args_3;
  args_local_3 = args_2;
  args_local_2 = (pool_ptr<soul::AST::Expression> *)args_1;
  args_local_1 = (Expression *)args;
  args_local = (Context *)this;
  newObject = (ArrayElementRef *)allocateSpaceForObject(this,0x50);
  this_00 = &(newObject->super_Expression).super_Statement.super_ASTObject.context;
  local_50 = (pool_ptr<soul::AST::Expression>)args_local_3->object;
  local_58.object = *(Expression **)args_local_4;
  AST::ArrayElementRef::ArrayElementRef
            ((ArrayElementRef *)this_00,(Context *)args_local_1,(Expression *)args_local_2,&local_50
             ,&local_58,(bool)((byte)newItem->size & 1));
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_58);
  pool_ptr<soul::AST::Expression>::~pool_ptr(&local_50);
  local_48 = (ArrayElementRef *)this_00;
  pDVar1 = allocate(soul::AST::Context_const&,soul::AST::Expression&,soul::pool_ptr&,soul::pool_ptr&,bool&&)
           ::{lambda(void*)#1}::operator_cast_to_function_pointer(local_65);
  *(DestructorFn **)&(newObject->super_Expression).super_Statement.super_ASTObject.objectType =
       pDVar1;
  return local_48;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }